

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  uint8_t *in_R8;
  uint in_R9D;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m_acbd_2;
  __m128i m_acbd;
  __m128i m_ac;
  __m128i m_i1;
  __m128i m_i0;
  int i;
  __m128i two_w;
  __m128i one_b;
  __m128i v_maxval;
  int local_16c;
  CONV_BUF_TYPE *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  __m128i *local_f8;
  __m128i *palStack_f0;
  undefined8 local_28;
  __m128i *palStack_20;
  int shift_00;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar1 = vpinsrw_avx(auVar1,0x40,7);
  local_f8 = auVar1._0_8_;
  palStack_f0 = auVar1._8_8_;
  shift_00 = 0x1010101;
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  local_28 = auVar1._0_8_;
  palStack_20 = auVar1._8_8_;
  auVar1 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar1 = vpinsrw_avx(auVar1,2,2);
  auVar1 = vpinsrw_avx(auVar1,2,3);
  auVar1 = vpinsrw_avx(auVar1,2,4);
  auVar1 = vpinsrw_avx(auVar1,2,5);
  auVar1 = vpinsrw_avx(auVar1,2,6);
  auVar1 = vpinsrw_avx(auVar1,2,7);
  auVar4 = ZEXT1664(auVar1);
  for (local_16c = 0; auVar2 = auVar4._0_16_, local_16c < (int)m[1]; local_16c = local_16c + 1) {
    xx_loadl_64(in_stack_00000008);
    auVar3 = auVar2;
    xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)(uint)m[0]));
    auVar2 = vpaddusb_avx(auVar2,auVar3);
    auVar3._8_8_ = palStack_20;
    auVar3._0_8_ = local_28;
    auVar2 = vpmaddubsw_avx(auVar2,auVar3);
    auVar2 = vpaddw_avx(auVar2,auVar1);
    auVar2 = vpsrlw_avx(auVar2,ZEXT416(2));
    auVar4 = ZEXT1664(auVar2);
    blend_a64_d16_mask_w4_sse41
              (in_R8,(CONV_BUF_TYPE *)CONCAT44(in_R9D,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,palStack_f0,local_f8,palStack_20,shift_00);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)((uint)m[0] << 1));
    in_R8 = in_R8 + (ulong)in_R9D * 2;
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  for (int i = 0; i < h; ++i) {
    const __m128i m_i0 = xx_loadl_64(mask);
    const __m128i m_i1 = xx_loadl_64(mask + mask_stride);
    const __m128i m_ac = _mm_adds_epu8(m_i0, m_i1);
    const __m128i m_acbd = _mm_maddubs_epi16(m_ac, one_b);
    const __m128i m_acbd_2 = _mm_add_epi16(m_acbd, two_w);
    const __m128i m = _mm_srli_epi16(m_acbd_2, 2);

    blend_a64_d16_mask_w4_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}